

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O2

t_int * sigframp_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pfVar3 = (float *)w[1];
  pfVar4 = (float *)w[2];
  pfVar5 = (float *)w[3];
  pfVar6 = (float *)w[4];
  fVar9 = *pfVar3;
  fVar12 = pfVar3[1];
  iVar7 = (int)w[5];
  fVar15 = *pfVar4;
  fVar1 = pfVar4[1];
  fVar14 = 1.0;
  *pfVar5 = 0.0;
  *pfVar6 = 0.0;
  lVar8 = 2;
  while( true ) {
    fVar11 = fVar1;
    pfVar6 = pfVar6 + 1;
    pfVar5 = pfVar5 + 1;
    if (iVar7 == (int)lVar8) break;
    fVar2 = pfVar3[lVar8];
    fVar1 = pfVar4[lVar8];
    fVar17 = (fVar9 + fVar2) * -0.5 + fVar12;
    fVar18 = (fVar15 + fVar1) * -0.5 + fVar11;
    fVar16 = fVar17 * fVar17 + fVar18 * fVar18;
    fVar13 = 0.0;
    fVar10 = 0.0;
    if (1e-19 < fVar16) {
      fVar9 = ((fVar9 - fVar2) * fVar17 + (fVar15 - fVar1) * fVar18) / (fVar16 + fVar16);
      fVar15 = ABS(fVar9);
      if (fVar15 <= 2.0) {
        fVar10 = fVar9 + fVar14;
      }
      fVar13 = (float)(~-(uint)(2.0 < fVar15) & (uint)fVar16);
    }
    *pfVar5 = fVar10;
    *pfVar6 = fVar13 * (1.0 / ((float)iVar7 * (float)iVar7));
    fVar14 = fVar14 + 1.0;
    lVar8 = lVar8 + 1;
    fVar9 = fVar12;
    fVar12 = fVar2;
    fVar15 = fVar11;
  }
  for (lVar8 = 0; iVar7 + 1 != (int)lVar8; lVar8 = lVar8 + 1) {
    pfVar5[lVar8] = 0.0;
    pfVar6[lVar8] = 0.0;
  }
  return w + 6;
}

Assistant:

static t_int *sigframp_perform(t_int *w)
{
    t_sample *inreal = (t_sample *)(w[1]);
    t_sample *inimag = (t_sample *)(w[2]);
    t_sample *outfreq = (t_sample *)(w[3]);
    t_sample *outamp = (t_sample *)(w[4]);
    t_sample lastreal = 0, currentreal = inreal[0], nextreal = inreal[1];
    t_sample lastimag = 0, currentimag = inimag[0], nextimag = inimag[1];
    int n = (int)w[5];
    int m = n + 1;
    t_sample fbin = 1, oneovern2 = 1.f/((t_sample)n * (t_sample)n);

    inreal += 2;
    inimag += 2;
    *outamp++ = *outfreq++ = 0;
    n -= 2;
    while (n--)
    {
        t_sample re, im, pow, freq;
        lastreal = currentreal;
        currentreal = nextreal;
        nextreal = *inreal++;
        lastimag = currentimag;
        currentimag = nextimag;
        nextimag = *inimag++;
        re = currentreal - 0.5f * (lastreal + nextreal);
        im = currentimag - 0.5f * (lastimag + nextimag);
        pow = re * re + im * im;
        if (pow > 1e-19)
        {
            t_sample detune = ((lastreal - nextreal) * re +
                    (lastimag - nextimag) * im) / (2.0f * pow);
            if (detune > 2 || detune < -2) freq = pow = 0;
            else freq = fbin + detune;
        }
        else freq = pow = 0;
        *outfreq++ = freq;
        *outamp++ = oneovern2 * pow;
        fbin += 1.0f;
    }
    while (m--) *outamp++ = *outfreq++ = 0;
    return (w+6);
}